

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

int cpu_ldsw_data_mips64(CPUArchState_conflict11 *env,target_ulong ptr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0x93;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x90;
  }
  uVar1 = load_helper(env,ptr,oi,0,MO_BEUW,false,full_be_lduw_mmu);
  return (int)(short)uVar1;
}

Assistant:

int cpu_ldsw_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldsw_data_ra(env, ptr, 0);
}